

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__Name_array
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  _Map_pointer ppEVar2;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  Name_array__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  ParserChar *text;
  undefined8 *puVar3;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::Name_array__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  puVar3 = (undefined8 *)*in_RSI;
  if (puVar3 == (undefined8 *)0x0) {
LAB_009bd096:
    if ((((ulong)(this_00->super_Parser)._vptr_Parser & 1) == 0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            text = (ParserChar *)*puVar3;
            if (text == (ParserChar *)0x0) {
              in_stack_ffffffffffffffc0 = 0;
              goto LAB_009bd096;
            }
            in_stack_ffffffffffffffb8 = GeneratedSaxParser::Utils::calculateStringHash(text);
            if (puVar3 + 1 == (undefined8 *)0x0) {
              return false;
            }
            in_stack_ffffffffffffffb0 = (ParserTemplateBase *)puVar3[1];
            puVar3 = puVar3 + 2;
            if (in_stack_ffffffffffffffb8 != 0x6f4) break;
            (this_00->super_Parser).mSaxParser = (SaxParser *)in_stack_ffffffffffffffb0;
          }
          if (in_stack_ffffffffffffffb8 != 0x74835) break;
          (this_00->super_Parser).mErrorHandler = (IErrorHandler *)in_stack_ffffffffffffffb0;
        }
        if (in_stack_ffffffffffffffb8 != 0x6a6c54) break;
        ppEVar2 = (_Map_pointer)
                  GeneratedSaxParser::Utils::toUint64
                            (in_RDI,(bool *)((long)&__DT_RELA[0x12b1a].r_addend + 4));
        (this_00->mElementDataStack).
        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
        ._M_impl.super__Deque_impl_data._M_map = ppEVar2;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                               (StringHash)text,in_stack_ffffffffffffffb8,
                               (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
          return false;
        }
        if ((in_stack_ffffffffffffffaf & 1) == 0) {
          *(uint *)&(this_00->super_Parser)._vptr_Parser =
               *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__Name_array( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__Name_array( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

Name_array__AttributeData* attributeData = newData<Name_array__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_COUNT:
    {
bool failed;
attributeData->count = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NAME_ARRAY,
        HASH_ATTRIBUTE_COUNT,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NAME_ARRAY, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_NAME_ARRAY, HASH_ATTRIBUTE_COUNT, 0 ) )
        return false;
}


    return true;
}